

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyAuxRef.cpp
# Opt level: O2

void __thiscall chrono::ChBodyAuxRef::SetFrame_REF_to_abs(ChBodyAuxRef *this,ChFrame<double> *mfra)

{
  ChFrameMoving<double> local_110;
  
  ChFrameMoving<double>::GetInverse(&local_110,&this->auxref_to_cog);
  ChFrame<double>::TransformLocalToParent
            (mfra,&local_110.super_ChFrame<double>,
             (ChFrame<double> *)&(this->super_ChBody).super_ChBodyFrame);
  ChFrameMoving<double>::operator=(&this->auxref_to_abs,mfra);
  return;
}

Assistant:

void ChBodyAuxRef::SetFrame_REF_to_abs(const ChFrame<>& mfra) {
    mfra.TransformLocalToParent(this->auxref_to_cog.GetInverse(), *this);
    // or, also, using overloaded operators for frames:
    //   *this = this->auxref_to_cog.GetInverse() >> mfra;

    auxref_to_abs = mfra;
}